

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtableview.cpp
# Opt level: O3

QRegion __thiscall QTableView::visualRegionForSelection(QTableView *this,QItemSelection *selection)

{
  QSpanCollection *pQVar1;
  QTableViewPrivate *this_00;
  QWidgetData *pQVar2;
  QAbstractItemModel *pQVar3;
  long lVar4;
  Span *span;
  QRect QVar5;
  QRect QVar6;
  QRect QVar7;
  ulong uVar8;
  bool bVar9;
  bool bVar10;
  char cVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  QItemSelectionRange *pQVar18;
  QPersistentModelIndex *this_01;
  uint uVar19;
  long in_RDX;
  QItemSelectionRange *pQVar20;
  ulong uVar21;
  undefined1 auVar22 [8];
  long in_FS_OFFSET;
  QRect QVar23;
  const_iterator __end3;
  QSet<QSpanCollection::Span_*> spansInRect;
  undefined1 local_a8 [8];
  QRect local_a0;
  QModelIndex local_90;
  undefined1 local_78 [8];
  QPersistentModelIndex QStack_70;
  QRect local_68;
  undefined1 local_58 [16];
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_48;
  long local_38;
  
  QVar23._8_8_ = QStack_70.d;
  QVar23._0_8_ = local_78;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(long *)(in_RDX + 0x10) == 0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      QRegion::QRegion((QRegion *)this);
      return (QRegion)this;
    }
  }
  else {
    this_00 = (QTableViewPrivate *)(selection->super_QList<QItemSelectionRange>).d.ptr;
    *(undefined1 **)
     &(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.super_QWidget =
         &DAT_aaaaaaaaaaaaaaaa;
    QRegion::QRegion((QRegion *)this);
    pQVar2 = ((this_00->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.viewport)->
             data;
    local_68.x2.m_i = (pQVar2->crect).x2.m_i - (pQVar2->crect).x1.m_i;
    local_68.y2.m_i = (pQVar2->crect).y2.m_i - (pQVar2->crect).y1.m_i;
    local_68.x1.m_i = 0;
    local_68.y1.m_i = 0;
    bVar9 = QHeaderView::sectionsMoved
                      ((QHeaderView *)(selection->super_QList<QItemSelectionRange>).d.ptr[0x58].br.d
                      );
    bVar10 = QHeaderView::sectionsMoved
                       ((QHeaderView *)
                        (selection->super_QList<QItemSelectionRange>).d.ptr[0x58].tl.d);
    QVar7._8_8_ = QStack_70.d;
    QVar7.x1.m_i = local_78._0_4_;
    QVar7.y1.m_i = local_78._4_4_;
    QVar6._8_8_ = QStack_70.d;
    QVar6.x1.m_i = local_78._0_4_;
    QVar6.y1.m_i = local_78._4_4_;
    QVar5._8_8_ = QStack_70.d;
    QVar5.x1.m_i = local_78._0_4_;
    QVar5.y1.m_i = local_78._4_4_;
    QVar23._8_8_ = QStack_70.d;
    QVar23.x1.m_i = local_78._0_4_;
    QVar23.y1.m_i = local_78._4_4_;
    if ((bVar9 && bVar10) ||
       ((pQVar1 = &this_00->spans, bVar9 || bVar10 &&
        ((QSpanCollection *)
         (this_00->spans).spans.
         super__List_base<QSpanCollection::Span_*,_std::allocator<QSpanCollection::Span_*>_>._M_impl
         ._M_node.super__List_node_base._M_next != pQVar1)))) {
      if (*(long *)(in_RDX + 0x10) != 0) {
        pQVar20 = *(QItemSelectionRange **)(in_RDX + 8);
        pQVar18 = pQVar20 + *(long *)(in_RDX + 0x10);
        this_01 = &(this_00->super_QAbstractItemViewPrivate).root;
        _local_78 = QVar7;
        do {
          QPersistentModelIndex::parent();
          cVar11 = comparesEqual(this_01,(QModelIndex *)local_58);
          if (cVar11 != '\0') {
            bVar9 = QItemSelectionRange::isValid(pQVar20);
            if (bVar9) {
              iVar12 = QPersistentModelIndex::row();
              iVar13 = QPersistentModelIndex::row();
              if (iVar12 <= iVar13) {
                do {
                  iVar13 = QPersistentModelIndex::column();
                  iVar14 = QPersistentModelIndex::column();
                  if (iVar13 <= iVar14) {
                    do {
                      pQVar3 = (this_00->super_QAbstractItemViewPrivate).model;
                      QPersistentModelIndex::operator_cast_to_QModelIndex(&local_90,this_01);
                      (**(code **)(*(long *)pQVar3 + 0x60))
                                ((QModelIndex *)local_58,pQVar3,iVar12,iVar13,&local_90);
                      QVar23 = (QRect)(**(code **)&(selection->super_QList<QItemSelectionRange>).d.d
                                                   [0x1e].super_QArrayData)
                                                (selection,(QModelIndex *)local_58);
                      _local_78 = QVar23;
                      cVar11 = QRect::intersects(&local_68);
                      if (cVar11 != '\0') {
                        QRegion::operator+=((QRegion *)this,(QRect *)local_78);
                      }
                      iVar14 = QPersistentModelIndex::column();
                      bVar9 = iVar13 < iVar14;
                      iVar13 = iVar13 + 1;
                    } while (bVar9);
                  }
                  iVar13 = QPersistentModelIndex::row();
                  bVar9 = iVar12 < iVar13;
                  iVar12 = iVar12 + 1;
                } while (bVar9);
              }
            }
          }
          pQVar20 = pQVar20 + 1;
          QVar23 = _local_78;
        } while (pQVar20 != pQVar18);
      }
    }
    else {
      pQVar20 = *(QItemSelectionRange **)(in_RDX + 8);
      lVar4 = *(long *)(in_RDX + 0x10);
      pQVar18 = pQVar20 + lVar4;
      if (bVar10) {
        QVar23 = QVar5;
        if (lVar4 != 0) {
          do {
            QPersistentModelIndex::parent();
            cVar11 = comparesEqual(&(this_00->super_QAbstractItemViewPrivate).root,
                                   (QModelIndex *)local_58);
            if ((cVar11 != '\0') && (bVar9 = QItemSelectionRange::isValid(pQVar20), bVar9)) {
              iVar12 = QPersistentModelIndex::row();
              iVar14 = QHeaderView::sectionViewportPosition
                                 ((QHeaderView *)
                                  (selection->super_QList<QItemSelectionRange>).d.ptr[0x58].br.d,
                                  iVar12);
              iVar12 = QPersistentModelIndex::row();
              iVar12 = QHeaderView::sectionViewportPosition
                                 ((QHeaderView *)
                                  (selection->super_QList<QItemSelectionRange>).d.ptr[0x58].br.d,
                                  iVar12);
              iVar13 = QPersistentModelIndex::row();
              iVar13 = QHeaderView::sectionSize
                                 ((QHeaderView *)
                                  (selection->super_QList<QItemSelectionRange>).d.ptr[0x58].br.d,
                                  iVar13);
              iVar13 = iVar13 + iVar12;
              iVar12 = iVar13;
              if (iVar14 < iVar13) {
                iVar12 = iVar14;
              }
              iVar15 = QPersistentModelIndex::column();
              iVar16 = QPersistentModelIndex::column();
              if (iVar15 <= iVar16) {
                if (iVar13 < iVar14) {
                  iVar13 = iVar14;
                }
                do {
                  local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
                  local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
                  iVar14 = QHeaderView::sectionViewportPosition
                                     ((QHeaderView *)
                                      (selection->super_QList<QItemSelectionRange>).d.ptr[0x58].tl.d
                                      ,iVar15);
                  iVar16 = QHeaderView::sectionSize
                                     ((QHeaderView *)
                                      (selection->super_QList<QItemSelectionRange>).d.ptr[0x58].tl.d
                                      ,iVar15);
                  local_58._4_4_ = iVar12;
                  local_58._0_4_ = iVar14;
                  local_58._8_4_ = iVar16 + iVar14 + -1;
                  local_58._12_4_ = iVar13 + -1;
                  cVar11 = QRect::intersects(&local_68);
                  if (cVar11 != '\0') {
                    QRegion::operator+=((QRegion *)this,(QRect *)local_58);
                  }
                  iVar14 = QPersistentModelIndex::column();
                  bVar9 = iVar15 < iVar14;
                  iVar15 = iVar15 + 1;
                } while (bVar9);
              }
            }
            QVar23._8_8_ = QStack_70.d;
            QVar23.x1.m_i = local_78._0_4_;
            QVar23.y1.m_i = local_78._4_4_;
            pQVar20 = pQVar20 + 1;
          } while (pQVar20 != pQVar18);
        }
      }
      else if (bVar9) {
        QVar23 = QVar6;
        if (lVar4 != 0) {
          do {
            QPersistentModelIndex::parent();
            cVar11 = comparesEqual(&(this_00->super_QAbstractItemViewPrivate).root,
                                   (QModelIndex *)local_58);
            if ((cVar11 != '\0') && (bVar9 = QItemSelectionRange::isValid(pQVar20), bVar9)) {
              iVar12 = QPersistentModelIndex::column();
              iVar14 = QHeaderView::sectionViewportPosition
                                 ((QHeaderView *)
                                  (selection->super_QList<QItemSelectionRange>).d.ptr[0x58].tl.d,
                                  iVar12);
              iVar12 = QPersistentModelIndex::column();
              iVar12 = QHeaderView::sectionViewportPosition
                                 ((QHeaderView *)
                                  (selection->super_QList<QItemSelectionRange>).d.ptr[0x58].tl.d,
                                  iVar12);
              iVar13 = QPersistentModelIndex::column();
              iVar13 = QHeaderView::sectionSize
                                 ((QHeaderView *)
                                  (selection->super_QList<QItemSelectionRange>).d.ptr[0x58].tl.d,
                                  iVar13);
              iVar13 = iVar13 + iVar12;
              iVar12 = iVar13;
              if (iVar14 < iVar13) {
                iVar12 = iVar14;
              }
              iVar15 = QPersistentModelIndex::row();
              iVar16 = QPersistentModelIndex::row();
              if (iVar15 <= iVar16) {
                if (iVar13 < iVar14) {
                  iVar13 = iVar14;
                }
                do {
                  local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
                  local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
                  iVar14 = QHeaderView::sectionViewportPosition
                                     ((QHeaderView *)
                                      (selection->super_QList<QItemSelectionRange>).d.ptr[0x58].br.d
                                      ,iVar15);
                  iVar16 = QHeaderView::sectionSize
                                     ((QHeaderView *)
                                      (selection->super_QList<QItemSelectionRange>).d.ptr[0x58].br.d
                                      ,iVar15);
                  local_58._4_4_ = iVar14;
                  local_58._0_4_ = iVar12;
                  local_58._8_4_ = iVar13 + -1;
                  local_58._12_4_ = iVar14 + -1 + iVar16;
                  cVar11 = QRect::intersects(&local_68);
                  if (cVar11 != '\0') {
                    QRegion::operator+=((QRegion *)this,(QRect *)local_58);
                  }
                  iVar14 = QPersistentModelIndex::row();
                  bVar9 = iVar15 < iVar14;
                  iVar15 = iVar15 + 1;
                } while (bVar9);
              }
            }
            QVar23._8_8_ = QStack_70.d;
            QVar23.x1.m_i = local_78._0_4_;
            QVar23.y1.m_i = local_78._4_4_;
            pQVar20 = pQVar20 + 1;
          } while (pQVar20 != pQVar18);
        }
      }
      else {
        QVar23 = QVar7;
        if (lVar4 != 0) {
          uVar19 = ~(int)*(char *)&(selection->super_QList<QItemSelectionRange>).d.ptr[0x54].tl.d;
          do {
            local_78 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
            QStack_70.d = (QPersistentModelIndexData *)&DAT_aaaaaaaaaaaaaaaa;
            QPersistentModelIndex::QPersistentModelIndex
                      ((QPersistentModelIndex *)local_78,&pQVar20->tl);
            QPersistentModelIndex::QPersistentModelIndex(&QStack_70,&pQVar20->br);
            QPersistentModelIndex::parent();
            cVar11 = comparesEqual(&(this_00->super_QAbstractItemViewPrivate).root,
                                   (QModelIndex *)local_58);
            if ((cVar11 != '\0') &&
               (bVar9 = QItemSelectionRange::isValid((QItemSelectionRange *)local_78), bVar9)) {
              QTableViewPrivate::trimHiddenSelections(this_00,(QItemSelectionRange *)local_78);
              iVar12 = QPersistentModelIndex::row();
              iVar12 = QHeaderView::sectionViewportPosition
                                 ((QHeaderView *)
                                  (selection->super_QList<QItemSelectionRange>).d.ptr[0x58].br.d,
                                  iVar12);
              iVar13 = QPersistentModelIndex::row();
              iVar13 = QHeaderView::sectionViewportPosition
                                 ((QHeaderView *)
                                  (selection->super_QList<QItemSelectionRange>).d.ptr[0x58].br.d,
                                  iVar13);
              iVar14 = QPersistentModelIndex::row();
              iVar14 = QHeaderView::sectionSize
                                 ((QHeaderView *)
                                  (selection->super_QList<QItemSelectionRange>).d.ptr[0x58].br.d,
                                  iVar14);
              QWidget::layoutDirection((QWidget *)selection);
              iVar15 = QPersistentModelIndex::column();
              iVar15 = QHeaderView::sectionViewportPosition
                                 ((QHeaderView *)
                                  (selection->super_QList<QItemSelectionRange>).d.ptr[0x58].tl.d,
                                  iVar15);
              iVar16 = QPersistentModelIndex::column();
              iVar16 = QHeaderView::sectionViewportPosition
                                 ((QHeaderView *)
                                  (selection->super_QList<QItemSelectionRange>).d.ptr[0x58].tl.d,
                                  iVar16);
              iVar17 = QPersistentModelIndex::column();
              iVar17 = QHeaderView::sectionSize
                                 ((QHeaderView *)
                                  (selection->super_QList<QItemSelectionRange>).d.ptr[0x58].tl.d,
                                  iVar17);
              local_a0.x2.m_i = iVar17 + iVar16 + uVar19;
              local_a0.y2.m_i = iVar13 + uVar19 + iVar14;
              local_a0.x1.m_i = iVar15;
              local_a0.y1.m_i = iVar12;
              cVar11 = QRect::intersects(&local_68);
              if (cVar11 != '\0') {
                QRegion::operator+=((QRegion *)this,&local_a0);
              }
              if ((QSpanCollection *)
                  (pQVar1->spans).
                  super__List_base<QSpanCollection::Span_*,_std::allocator<QSpanCollection::Span_*>_>
                  ._M_impl._M_node.super__List_node_base._M_next != pQVar1) {
                local_a8 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
                iVar12 = QPersistentModelIndex::column();
                iVar13 = QPersistentModelIndex::row();
                iVar14 = QPersistentModelIndex::column();
                iVar15 = QPersistentModelIndex::column();
                QPersistentModelIndex::row();
                QPersistentModelIndex::row();
                QSpanCollection::spansInRect
                          ((QSpanCollection *)local_a8,(int)pQVar1,iVar12,iVar13,
                           (iVar14 - iVar15) + 1);
                if (local_a8 == (undefined1  [8])0x0) {
LAB_00589a93:
                  uVar21 = 0;
                  auVar22 = (undefined1  [8])(Data *)0x0;
LAB_00589a99:
                  if (auVar22 != (undefined1  [8])0x0 || uVar21 != 0) goto LAB_00589aa5;
                }
                else {
                  auVar22 = local_a8;
                  if ((*(Span **)((long)local_a8 + 0x20))->offsets[0] == 0xff) {
                    uVar8 = 1;
                    do {
                      uVar21 = uVar8;
                      if (*(size_t *)((long)local_a8 + 0x10) == uVar21) goto LAB_00589a93;
                      uVar8 = uVar21 + 1;
                    } while ((*(Span **)((long)local_a8 + 0x20))[uVar21 >> 7].offsets
                             [(uint)uVar21 & 0x7f] == 0xff);
                    goto LAB_00589a99;
                  }
                  uVar21 = 0;
LAB_00589aa5:
                  do {
                    span = *(Span **)((Data *)auVar22)->spans[uVar21 >> 7].entries
                                     [((Data *)auVar22)->spans[uVar21 >> 7].offsets
                                      [(uint)uVar21 & 0x7f]].storage.data;
                    iVar12 = span->m_top;
                    iVar13 = span->m_left;
                    QPersistentModelIndex::parent();
                    iVar14 = QPersistentModelIndex::row();
                    if ((((iVar12 <= iVar14) &&
                         (iVar14 = QPersistentModelIndex::column(), iVar13 <= iVar14)) &&
                        (iVar14 = QPersistentModelIndex::row(), iVar14 <= iVar12)) &&
                       (iVar12 = QPersistentModelIndex::column(), iVar12 <= iVar13)) {
                      QPersistentModelIndex::parent();
                      if (((local_58._0_4_ == local_90.r) && (local_58._4_4_ == local_90.c)) &&
                         ((local_58._8_8_ == local_90.i && (local_48.ptr == local_90.m.ptr)))) {
                        local_58 = (undefined1  [16])QTableViewPrivate::visualSpanRect(this_00,span)
                        ;
                        cVar11 = QRect::intersects(&local_68);
                        if (cVar11 != '\0') {
                          QRegion::operator+=((QRegion *)this,(QRect *)local_58);
                        }
                      }
                    }
                    do {
                      if (((Data *)auVar22)->numBuckets - 1 == uVar21) {
                        auVar22 = (undefined1  [8])0x0;
                        uVar21 = 0;
                        break;
                      }
                      uVar21 = uVar21 + 1;
                    } while (((Data *)auVar22)->spans[uVar21 >> 7].offsets[(uint)uVar21 & 0x7f] ==
                             0xff);
                  } while ((auVar22 != (undefined1  [8])0x0) || (uVar21 != 0));
                }
                QHash<QSpanCollection::Span_*,_QHashDummyValue>::~QHash
                          ((QHash<QSpanCollection::Span_*,_QHashDummyValue> *)local_a8);
              }
            }
            QPersistentModelIndex::~QPersistentModelIndex(&QStack_70);
            QPersistentModelIndex::~QPersistentModelIndex((QPersistentModelIndex *)local_78);
            QVar23._8_8_ = QStack_70.d;
            QVar23.x1.m_i = local_78._0_4_;
            QVar23.y1.m_i = local_78._4_4_;
            pQVar20 = pQVar20 + 1;
          } while (pQVar20 != pQVar18);
        }
      }
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return (QRegion)this;
    }
  }
  _local_78 = QVar23;
  __stack_chk_fail();
}

Assistant:

QRegion QTableView::visualRegionForSelection(const QItemSelection &selection) const
{
    Q_D(const QTableView);

    if (selection.isEmpty())
        return QRegion();

    QRegion selectionRegion;
    const QRect &viewportRect = d->viewport->rect();
    bool verticalMoved = verticalHeader()->sectionsMoved();
    bool horizontalMoved = horizontalHeader()->sectionsMoved();

    if ((verticalMoved && horizontalMoved) || (d->hasSpans() && (verticalMoved || horizontalMoved))) {
        for (const auto &range : selection) {
            if (range.parent() != d->root || !range.isValid())
                continue;
            for (int r = range.top(); r <= range.bottom(); ++r)
                for (int c = range.left(); c <= range.right(); ++c) {
                    const QRect &rangeRect = visualRect(d->model->index(r, c, d->root));
                    if (viewportRect.intersects(rangeRect))
                        selectionRegion += rangeRect;
                }
        }
    } else if (horizontalMoved) {
        for (const auto &range : selection) {
            if (range.parent() != d->root || !range.isValid())
                continue;
            int top = rowViewportPosition(range.top());
            int bottom = rowViewportPosition(range.bottom()) + rowHeight(range.bottom());
            if (top > bottom)
                qSwap<int>(top, bottom);
            int height = bottom - top;
            for (int c = range.left(); c <= range.right(); ++c) {
                const QRect rangeRect(columnViewportPosition(c), top, columnWidth(c), height);
                if (viewportRect.intersects(rangeRect))
                    selectionRegion += rangeRect;
            }
        }
    } else if (verticalMoved) {
        for (const auto &range : selection) {
            if (range.parent() != d->root || !range.isValid())
                continue;
            int left = columnViewportPosition(range.left());
            int right = columnViewportPosition(range.right()) + columnWidth(range.right());
            if (left > right)
                qSwap<int>(left, right);
            int width = right - left;
            for (int r = range.top(); r <= range.bottom(); ++r) {
                const QRect rangeRect(left, rowViewportPosition(r), width, rowHeight(r));
                if (viewportRect.intersects(rangeRect))
                    selectionRegion += rangeRect;
            }
        }
    } else { // nothing moved
        const int gridAdjust = showGrid() ? 1 : 0;
        for (auto range : selection) {
            if (range.parent() != d->root || !range.isValid())
                continue;
            d->trimHiddenSelections(&range);

            const int rtop = rowViewportPosition(range.top());
            const int rbottom = rowViewportPosition(range.bottom()) + rowHeight(range.bottom());
            int rleft;
            int rright;
            if (isLeftToRight()) {
                rleft = columnViewportPosition(range.left());
                rright = columnViewportPosition(range.right()) + columnWidth(range.right());
            } else {
                rleft = columnViewportPosition(range.right());
                rright = columnViewportPosition(range.left()) + columnWidth(range.left());
            }
            const QRect rangeRect(QPoint(rleft, rtop), QPoint(rright - 1 - gridAdjust, rbottom - 1 - gridAdjust));
            if (viewportRect.intersects(rangeRect))
                selectionRegion += rangeRect;
            if (d->hasSpans()) {
                const auto spansInRect = d->spans.spansInRect(range.left(), range.top(), range.width(), range.height());
                for (QSpanCollection::Span *s : spansInRect) {
                    if (range.contains(s->top(), s->left(), range.parent())) {
                        const QRect &visualSpanRect = d->visualSpanRect(*s);
                        if (viewportRect.intersects(visualSpanRect))
                            selectionRegion += visualSpanRect;
                    }
                }
            }
        }
    }

    return selectionRegion;
}